

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int addbyter(int output,FILE *data)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (data->_IO_read_ptr < data->_IO_read_end) {
    **(undefined1 **)data = (char)output;
    *(long *)data = *(long *)data + 1;
    data->_IO_read_ptr = data->_IO_read_ptr + 1;
    uVar1 = output & 0xff;
  }
  return uVar1;
}

Assistant:

static int addbyter(int output, FILE *data)
{
  struct nsprintf *infop = (struct nsprintf *)data;
  unsigned char outc = (unsigned char)output;

  if(infop->length < infop->max) {
    /* only do this if we haven't reached max length yet */
    infop->buffer[0] = outc; /* store */
    infop->buffer++; /* increase pointer */
    infop->length++; /* we are now one byte larger */
    return outc;     /* fputc() returns like this on success */
  }
  return -1;
}